

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O2

netaddr * os_interface_generic_get_bindaddress(int af_type,netaddr_acl *filter,os_interface *os_if)

{
  uint8_t uVar1;
  netaddr *pnVar2;
  uint8_t uVar3;
  netaddr *pnVar4;
  
  if ((((os_if == (os_interface *)0x0) || ((os_if->flags).any == true)) &&
      (filter->reject_count == 0)) && (0xfffffffffffffffd < filter->accept_count - 3)) {
    pnVar4 = filter->accept;
    uVar1 = pnVar4->_prefix_len;
    uVar3 = netaddr_get_af_maxprefix(pnVar4->_type);
    if (uVar1 == uVar3) {
      if (filter->accept_count == 2) {
        pnVar2 = filter->accept;
        if ((pnVar4->_type == pnVar2[1]._type) ||
           (uVar1 = pnVar2[1]._prefix_len, uVar3 = netaddr_get_af_maxprefix(), uVar1 != uVar3))
        goto LAB_00104a9a;
        if ((uint)pnVar2[1]._type == af_type) {
          return pnVar2 + 1;
        }
      }
      if ((uint)pnVar4->_type == af_type) {
        return pnVar4;
      }
    }
  }
LAB_00104a9a:
  pnVar4 = _get_exact_match_bindaddress(af_type,filter,os_if);
  if (pnVar4 != (netaddr *)0x0) {
    return pnVar4;
  }
  pnVar4 = _get_matching_bindaddress(af_type,filter,os_if);
  return pnVar4;
}

Assistant:

const struct netaddr *
os_interface_generic_get_bindaddress(int af_type, struct netaddr_acl *filter, struct os_interface *os_if) {
  const struct netaddr *result;

  result = NULL;
  if (os_if == NULL || os_if->flags.any) {
    result = _get_fixed_prefix(af_type, filter);
  }
  if (!result) {
    result = _get_exact_match_bindaddress(af_type, filter, os_if);
  }
  if (!result) {
    result = _get_matching_bindaddress(af_type, filter, os_if);
  }
  return result;
}